

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void stx::
     btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
     ::shift_left_inner(inner_node *left,inner_node *right,inner_node *parent,uint parentslot)

{
  unsigned_short *puVar1;
  node **__src;
  ushort uVar2;
  uint uVar3;
  size_t sVar4;
  key_type *__src_00;
  uint uVar5;
  uint uVar7;
  ulong uVar6;
  
  uVar2 = (left->super_node).slotuse;
  uVar7 = (uint)(right->super_node).slotuse - (uint)uVar2;
  left->slotkey[uVar2] = parent->slotkey[parentslot];
  uVar5 = (int)uVar7 >> 1;
  uVar6 = (ulong)uVar5;
  uVar3 = uVar2 + 1;
  (left->super_node).slotuse = (unsigned_short)uVar3;
  __src_00 = right->slotkey;
  if (uVar5 != 1) {
    memmove(left->slotkey + (uVar3 & 0xffff),__src_00,uVar6 * 8 - 8);
  }
  __src = right->childid;
  if (1 < uVar7) {
    memmove(left->childid + (left->super_node).slotuse,__src,uVar6 * 8);
  }
  puVar1 = &(left->super_node).slotuse;
  *puVar1 = *puVar1 + (short)(uVar5 - 1);
  parent->slotkey[parentslot] = right->slotkey[uVar5 - 1];
  uVar2 = (right->super_node).slotuse;
  sVar4 = (long)__src_00 + ((ulong)uVar2 * 8 - (long)(right->slotkey + uVar6));
  if (sVar4 != 0) {
    memmove(__src_00,right->slotkey + uVar6,sVar4);
  }
  sVar4 = (long)__src + (((ulong)uVar2 * 8 + 8) - (long)(right->childid + uVar6));
  if (sVar4 != 0) {
    memmove(__src,right->childid + uVar6,sVar4);
  }
  (right->super_node).slotuse = uVar2 - (short)uVar5;
  return;
}

Assistant:

static void shift_left_inner(inner_node *left, inner_node *right, inner_node *parent, unsigned int parentslot)
        {
            BTREE_ASSERT(left->level == right->level);
            BTREE_ASSERT(parent->level == left->level + 1);

            BTREE_ASSERT(left->slotuse < right->slotuse);
            BTREE_ASSERT(parent->childid[parentslot] == left);

            unsigned int shiftnum = (right->slotuse - left->slotuse) >> 1;

            BTREE_PRINT("Shifting (inner) " << shiftnum << " entries to left " << left << " from right " << right << " with common parent " << parent << ".");

            BTREE_ASSERT(left->slotuse + shiftnum < innerslotmax);

            if (selfverify)
            {
                // find the left node's slot in the parent's children and compare to parentslot

                unsigned int leftslot = 0;
                while(leftslot <= parent->slotuse && parent->childid[leftslot] != left)
                    ++leftslot;

                BTREE_ASSERT(leftslot < parent->slotuse);
                BTREE_ASSERT(parent->childid[leftslot] == left);
                BTREE_ASSERT(parent->childid[leftslot+1] == right);

                BTREE_ASSERT(leftslot == parentslot);
            }

            // copy the parent's decision slotkey and childid to the first new key on the left
            left->slotkey[left->slotuse] = parent->slotkey[parentslot];
            left->slotuse++;

            // copy the other items from the right node to the last slots in the left node.

            std::copy(right->slotkey, right->slotkey + shiftnum-1,
                      left->slotkey + left->slotuse);
            std::copy(right->childid, right->childid + shiftnum,
                      left->childid + left->slotuse);

            left->slotuse += shiftnum - 1;

            // fixup parent
            parent->slotkey[parentslot] = right->slotkey[shiftnum - 1];

            // shift all slots in the right node

            std::copy(right->slotkey + shiftnum, right->slotkey + right->slotuse,
                      right->slotkey);
            std::copy(right->childid + shiftnum, right->childid + right->slotuse+1,
                      right->childid);

            right->slotuse -= shiftnum;
        }